

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BOV.c
# Opt level: O0

bov_points_t * bov_points_new(GLfloat (*coords) [2],GLsizei n,GLenum usage)

{
  GLsizei local_64;
  undefined4 local_60;
  undefined4 local_5c;
  undefined4 local_58;
  undefined4 local_54;
  undefined4 local_50;
  undefined4 local_4c;
  undefined4 local_48;
  undefined4 local_44;
  undefined4 local_40;
  undefined4 local_3c;
  undefined4 local_38;
  undefined4 local_34;
  undefined4 local_30;
  undefined4 local_2c;
  undefined4 local_28;
  undefined4 local_24;
  bov_points_t *local_20;
  bov_points_t *points;
  GLenum usage_local;
  GLsizei n_local;
  GLfloat (*coords_local) [2];
  
  points._0_4_ = usage;
  points._4_4_ = n;
  _usage_local = coords;
  local_20 = (bov_points_t *)malloc(0x50);
  if (local_20 == (bov_points_t *)0x0) {
    bov_error_log(0x30001,"Memory allocation failed");
    fprintf(_stderr,"\t(in function %s, line %d)\n","bov_points_new",0x506);
    exit(1);
  }
  if (_usage_local == (GLfloat (*) [2])0x0) {
    local_64 = 0;
  }
  else {
    local_64 = points._4_4_;
  }
  local_20->vboLen = local_64;
  local_60 = 0;
  local_5c = 0;
  local_58 = 0;
  local_54 = 0x3f800000;
  local_50 = 0x3f800000;
  local_4c = 0x3f800000;
  local_48 = 0x3f800000;
  local_44 = 0x3f800000;
  local_40 = 0;
  local_3c = 0;
  local_38 = 0x3f800000;
  local_34 = 0x3f800000;
  local_30 = 0x3ccccccd;
  local_2c = 0;
  local_28 = 0xbf800000;
  local_24 = 0;
  memcpy(&local_20->param,&local_60,0x40);
  (*glad_glGenVertexArrays)(1,&local_20->vao);
  (*glad_glBindVertexArray)(local_20->vao);
  (*glad_glGenBuffers)(1,&local_20->vbo);
  (*glad_glBindBuffer)(0x8892,local_20->vbo);
  (*glad_glVertexAttribPointer)(0,2,0x1406,'\0',0,(void *)0x0);
  (*glad_glEnableVertexAttribArray)(0);
  (*glad_glBufferData)(0x8892,(long)points._4_4_ << 3,_usage_local,(GLenum)points);
  local_20->vboCapacity = points._4_4_;
  return local_20;
}

Assistant:

bov_points_t* bov_points_new(const GLfloat coords[][2],
                             GLsizei n,
                             GLenum usage)
{
	bov_points_t* points = malloc(sizeof(bov_points_t));
	CHECK_MALLOC(points);

	points->vboLen = coords==NULL ? 0 : n;

	points->param = (bov_points_param_t) {
		.fillColor = {0.0f, 0.0f, 0.0f, 1.0f}, // color
		.outlineColor = {1.0f ,1.0f, 1.0f, 1.0f}, // outlineColor
		.pos = {0.0f ,0.0f},           // other
		.scale = {1.0f, 1.0f},           // localPos
		.width = 0.025f,
		.marker = 0.0f,
		.outlineWidth = -1.0f,
		.spaceType = USUAL_SPACE
	};

	// Create Vertex Array Object
	glGenVertexArrays(1, &points->vao);
	glBindVertexArray(points->vao);

	// Vertex Buffer Object
	glGenBuffers(1, &points->vbo);
	glBindBuffer(GL_ARRAY_BUFFER, points->vbo);

	// specify the layout of the data
	glVertexAttribPointer(POS_LOCATION, 2, GL_FLOAT, GL_FALSE, 0, 0);
	glEnableVertexAttribArray(POS_LOCATION);

	glBufferData(GL_ARRAY_BUFFER, sizeof(GLfloat) * 2 * n, coords, usage);
	points->vboCapacity = n;

	// glBindBuffer(GL_ARRAY_BUFFER, 0);
	// glBindVertexArray(0);

	return points;
}